

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
Outputs::Display::OpenGL::Shader::Shader
          (Shader *this,string *vertex_shader,string *fragment_shader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *binding_names)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer __args;
  GLuint index;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  bindings;
  uint local_5c;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *local_58;
  string *local_50;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  local_48;
  
  (this->function_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->function_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->function_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->function_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->enqueued_functions_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->function_mutex_).super___mutex_base._M_mutex.__align = 0;
  (this->enqueued_functions_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enqueued_functions_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = 0;
  local_58 = &this->enqueued_functions_;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (binding_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = fragment_shader;
  for (__args = (binding_names->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pbVar1; __args = __args + 1) {
    std::
    vector<Outputs::Display::OpenGL::Shader::AttributeBinding,std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>>
    ::emplace_back<std::__cxx11::string_const&,unsigned_int&>
              ((vector<Outputs::Display::OpenGL::Shader::AttributeBinding,std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>>
                *)&local_48,__args,&local_5c);
    local_5c = local_5c + 1;
  }
  init(this,(EVP_PKEY_CTX *)vertex_shader);
  std::
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ::~vector(&local_48);
  return;
}

Assistant:

Shader::Shader(const std::string &vertex_shader, const std::string &fragment_shader, const std::vector<std::string> &binding_names) {
	std::vector<AttributeBinding> bindings;
	GLuint index = 0;
	for(const auto &name: binding_names) {
		bindings.emplace_back(name, index);
		++index;
	}
	init(vertex_shader, fragment_shader, bindings);
}